

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::perturbMin(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *__return_storage_ptr__,
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *uvec,
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *p_low,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *p_up,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *eps,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 p_delta,Status *stat,int start,int incr)

{
  uint *puVar1;
  pointer pnVar2;
  pointer pnVar3;
  undefined8 uVar4;
  pointer pnVar5;
  double dVar6;
  double dVar7;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  bool bVar9;
  type_conflict5 tVar10;
  double *pdVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_778;
  Real local_740;
  cpp_dec_float<50U,_int,_void> local_738;
  cpp_dec_float<50U,_int,_void> *local_6f8;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_6f0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_6e8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_6e0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_6d8;
  Random *local_6d0;
  cpp_dec_float<50U,_int,_void> local_6c8;
  cpp_dec_float<50U,_int,_void> *local_690;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_688;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_648;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_608;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_588;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_548;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_508;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_488;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_408;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_388;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxrandom;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minrandom;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pnVar2 = (uvec->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  maxrandom.m_backend.data._M_elems[0] = 0;
  maxrandom.m_backend.data._M_elems[1] = 0x40240000;
  minrandom.m_backend.fpclass = cpp_dec_float_finite;
  minrandom.m_backend.prec_elem = 10;
  minrandom.m_backend.data._M_elems[0] = 0;
  minrandom.m_backend.data._M_elems[1] = 0;
  minrandom.m_backend.data._M_elems[2] = 0;
  minrandom.m_backend.data._M_elems[3] = 0;
  minrandom.m_backend.data._M_elems[4] = 0;
  minrandom.m_backend.data._M_elems[5] = 0;
  minrandom.m_backend.data._M_elems._24_5_ = 0;
  minrandom.m_backend.data._M_elems[7]._1_3_ = 0;
  minrandom.m_backend.data._M_elems._32_5_ = 0;
  minrandom.m_backend._37_8_ = 0;
  local_6f8 = &__return_storage_ptr__->m_backend;
  local_6f0 = uvec;
  local_6e8 = this;
  local_6e0 = p_low;
  local_6d8 = p_up;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
            (&minrandom.m_backend,
             (cpp_dec_float<50U,_int,_void> *)p_delta.m_backend.data._M_elems._0_8_,
             (double *)&maxrandom);
  local_6c8.data._M_elems._0_8_ = 100.0;
  maxrandom.m_backend.fpclass = cpp_dec_float_finite;
  maxrandom.m_backend.prec_elem = 10;
  maxrandom.m_backend.data._M_elems[0] = 0;
  maxrandom.m_backend.data._M_elems[1] = 0;
  maxrandom.m_backend.data._M_elems[2] = 0;
  maxrandom.m_backend.data._M_elems[3] = 0;
  maxrandom.m_backend.data._M_elems[4] = 0;
  maxrandom.m_backend.data._M_elems[5] = 0;
  maxrandom.m_backend.data._M_elems._24_5_ = 0;
  maxrandom.m_backend.data._M_elems[7]._1_3_ = 0;
  maxrandom.m_backend.data._M_elems._32_5_ = 0;
  maxrandom.m_backend._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
            (&maxrandom.m_backend,
             (cpp_dec_float<50U,_int,_void> *)p_delta.m_backend.data._M_elems._0_8_,
             (double *)&local_6c8);
  pSVar8 = local_6e8;
  local_6c8.fpclass = cpp_dec_float_finite;
  local_6c8.prec_elem = 10;
  local_6c8.data._M_elems._0_8_ = 0.0;
  local_6c8.data._M_elems[2] = 0;
  local_6c8.data._M_elems[3] = 0;
  local_6c8.data._M_elems[4] = 0;
  local_6c8.data._M_elems[5] = 0;
  local_6c8.data._M_elems._24_5_ = 0;
  local_6c8.data._M_elems[7]._1_3_ = 0;
  local_6c8.data._M_elems._32_5_ = 0;
  local_6c8.data._M_elems[9]._1_3_ = 0;
  local_6c8.exp = 0;
  local_6c8.neg = false;
  local_778.fpclass = cpp_dec_float_finite;
  local_778.prec_elem = 10;
  local_778.data._M_elems[0] = 0;
  local_778.data._M_elems[1] = 0;
  local_778.data._M_elems[2] = 0;
  local_778.data._M_elems[3] = 0;
  local_778.data._M_elems[4] = 0;
  local_778.data._M_elems[5] = 0;
  local_778.data._M_elems[6] = 0;
  local_778.data._M_elems[7] = 0;
  local_778.data._M_elems._32_5_ = 0;
  local_778.data._M_elems[9]._1_3_ = 0;
  local_778.exp = 0;
  local_778.neg = false;
  local_738.fpclass = cpp_dec_float_finite;
  local_738.prec_elem = 10;
  local_738.data._M_elems[0] = 0;
  local_738.data._M_elems[1] = 0;
  local_738.data._M_elems[2] = 0;
  local_738.data._M_elems[3] = 0;
  local_738.data._M_elems[4] = 0;
  local_738.data._M_elems[5] = 0;
  local_738.data._M_elems[6] = 0;
  local_738.data._M_elems[7] = 0;
  local_738.data._M_elems._32_5_ = 0;
  local_738.data._M_elems[9]._1_3_ = 0;
  local_738.exp = 0;
  local_738.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (local_6f8,0,(type *)0x0);
  if (pSVar8->fullPerturbation == true) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&eps->m_backend,
               (cpp_dec_float<50U,_int,_void> *)p_delta.m_backend.data._M_elems._0_8_);
    for (uVar14 = ~p_delta.m_backend.data._M_elems[4] +
                  (int)(((long)(local_6f0->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_6f0->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x38); -1 < (int)uVar14;
        uVar14 = uVar14 - p_delta.m_backend.data._M_elems[6]) {
      uVar13 = (ulong)uVar14;
      pnVar3 = (local_6d8->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_688.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)&pnVar3[uVar13].m_backend.data + 0x20);
      local_738.data._M_elems._32_5_ = local_688.m_backend.data._M_elems._32_5_;
      local_738.data._M_elems[9]._1_3_ = local_688.m_backend.data._M_elems[9]._1_3_;
      local_738.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[uVar13].m_backend.data;
      local_738.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[uVar13].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[uVar13].m_backend.data + 0x10);
      local_738.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_738.data._M_elems[6] = (uint)uVar4;
      local_738.data._M_elems[7] = (uint)((ulong)uVar4 >> 0x20);
      local_738.exp = pnVar3[uVar13].m_backend.exp;
      local_738.neg = pnVar3[uVar13].m_backend.neg;
      local_688.m_backend.fpclass = pnVar3[uVar13].m_backend.fpclass;
      local_688.m_backend.prec_elem = pnVar3[uVar13].m_backend.prec_elem;
      local_738.prec_elem = local_688.m_backend.prec_elem;
      local_738.fpclass = local_688.m_backend.fpclass;
      pnVar3 = (local_6e0->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = *(undefined8 *)((long)&pnVar3[uVar13].m_backend.data + 0x20);
      local_778.data._M_elems._32_5_ = SUB85(uVar4,0);
      local_778.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_778.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[uVar13].m_backend.data;
      local_778.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[uVar13].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[uVar13].m_backend.data + 0x10);
      local_778.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_778.data._M_elems[6] = (uint)uVar4;
      local_778.data._M_elems[7] = (uint)((ulong)uVar4 >> 0x20);
      local_778.exp = pnVar3[uVar13].m_backend.exp;
      local_778.neg = pnVar3[uVar13].m_backend.neg;
      local_778.fpclass = pnVar3[uVar13].m_backend.fpclass;
      local_778.prec_elem = pnVar3[uVar13].m_backend.prec_elem;
      local_6f0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)(pnVar2 + uVar13);
      local_6c8.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[uVar13].m_backend;
      local_6c8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar2[uVar13].m_backend + 8);
      local_6c8.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar2 + uVar13) + 0x10);
      uVar4 = *(undefined8 *)((long)(pnVar2 + uVar13) + 0x18);
      local_6c8.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_6c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_6c8.data._M_elems._32_5_ = SUB85(*(undefined8 *)((long)(pnVar2 + uVar13) + 0x20),0);
      local_6c8.data._M_elems[9]._1_3_ =
           (undefined3)((ulong)*(undefined8 *)((long)(pnVar2 + uVar13) + 0x20) >> 0x28);
      local_6c8.exp = *(int *)((long)(pnVar2 + uVar13) + 0x28);
      local_6c8.neg = *(bool *)((long)(pnVar2 + uVar13) + 0x2c);
      local_6c8._48_8_ = *(undefined8 *)((long)(pnVar2 + uVar13) + 0x30);
      local_688.m_backend.data._M_elems[0] = local_738.data._M_elems[0];
      local_688.m_backend.data._M_elems[1] = local_738.data._M_elems[1];
      local_688.m_backend.data._M_elems[2] = local_738.data._M_elems[2];
      local_688.m_backend.data._M_elems[3] = local_738.data._M_elems[3];
      local_688.m_backend.data._M_elems[4] = local_738.data._M_elems[4];
      local_688.m_backend.data._M_elems[5] = local_738.data._M_elems[5];
      local_688.m_backend.data._M_elems[6] = local_738.data._M_elems[6];
      local_688.m_backend.data._M_elems[7] = local_738.data._M_elems[7];
      local_688.m_backend.exp = local_738.exp;
      local_688.m_backend.neg = local_738.neg;
      pdVar11 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_68,*pdVar11,(type *)0x0);
      local_1c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8)
      ;
      local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      local_1c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      local_1c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4)
      ;
      local_1c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6)
      ;
      local_1c8.m_backend.exp = (eps->m_backend).exp;
      local_1c8.m_backend.neg = (eps->m_backend).neg;
      local_1c8.m_backend.fpclass = (eps->m_backend).fpclass;
      local_1c8.m_backend.prec_elem = (eps->m_backend).prec_elem;
      bVar9 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_688,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_68,&local_1c8);
      if (bVar9) {
        local_208.m_backend.data._M_elems[9]._1_3_ = local_778.data._M_elems[9]._1_3_;
        local_208.m_backend.data._M_elems._32_5_ = local_778.data._M_elems._32_5_;
        local_208.m_backend.data._M_elems[7] = local_778.data._M_elems[7];
        local_208.m_backend.data._M_elems[6] = local_778.data._M_elems[6];
        local_208.m_backend.data._M_elems[4] = local_778.data._M_elems[4];
        local_208.m_backend.data._M_elems[5] = local_778.data._M_elems[5];
        local_208.m_backend.data._M_elems[0] = local_778.data._M_elems[0];
        local_208.m_backend.data._M_elems[1] = local_778.data._M_elems[1];
        local_208.m_backend.data._M_elems[2] = local_778.data._M_elems[2];
        local_208.m_backend.data._M_elems[3] = local_778.data._M_elems[3];
        local_208.m_backend.exp = local_778.exp;
        local_208.m_backend.neg = local_778.neg;
        local_208.m_backend.fpclass = local_778.fpclass;
        local_208.m_backend.prec_elem = local_778.prec_elem;
        local_248.m_backend.data._M_elems[7] = local_738.data._M_elems[7];
        local_248.m_backend.data._M_elems[6] = local_738.data._M_elems[6];
        local_248.m_backend.data._M_elems[0] = local_738.data._M_elems[0];
        local_248.m_backend.data._M_elems[1] = local_738.data._M_elems[1];
        local_248.m_backend.data._M_elems[2] = local_738.data._M_elems[2];
        local_248.m_backend.data._M_elems[3] = local_738.data._M_elems[3];
        local_248.m_backend.data._M_elems[4] = local_738.data._M_elems[4];
        local_248.m_backend.data._M_elems[5] = local_738.data._M_elems[5];
        local_248.m_backend.data._M_elems[9]._1_3_ = local_738.data._M_elems[9]._1_3_;
        local_248.m_backend.data._M_elems._32_5_ = local_738.data._M_elems._32_5_;
        local_248.m_backend.exp = local_738.exp;
        local_248.m_backend.neg = local_738.neg;
        local_248.m_backend.fpclass = local_738.fpclass;
        local_248.m_backend.prec_elem = local_738.prec_elem;
        local_288.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_288.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_288.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_288.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_288.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_288.m_backend.exp = (eps->m_backend).exp;
        local_288.m_backend.neg = (eps->m_backend).neg;
        local_288.m_backend.fpclass = (eps->m_backend).fpclass;
        local_288.m_backend.prec_elem = (eps->m_backend).prec_elem;
        bVar9 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_208,&local_248,&local_288);
        if (bVar9) {
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend.data._M_elems[9]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1.m_backend,&local_6c8,&eps->m_backend);
          tVar10 = boost::multiprecision::operator<=
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_738,&result_1);
          if ((tVar10) &&
             (*(int *)(p_delta.m_backend.data._M_elems._8_8_ + uVar13 * 4) * local_6e8->theRep < 0))
          {
            dVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double
                              (&minrandom.m_backend);
            dVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double
                              (&maxrandom.m_backend);
            local_740 = Random::next(&pSVar8->random,dVar6,dVar7);
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems._24_5_ = 0;
            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
            result_1.m_backend.data._M_elems._32_5_ = 0;
            result_1.m_backend.data._M_elems[9]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                      (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)local_6f0,&local_740);
            pnVar3 = (local_6d8->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)((long)&pnVar3[uVar13].m_backend.data + 0x20) =
                 CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                          result_1.m_backend.data._M_elems._32_5_);
            puVar1 = (uint *)((long)&pnVar3[uVar13].m_backend.data + 0x10);
            *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._16_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,
                          result_1.m_backend.data._M_elems._24_5_);
            *(undefined8 *)&pnVar3[uVar13].m_backend.data = result_1.m_backend.data._M_elems._0_8_;
            *(undefined8 *)((long)&pnVar3[uVar13].m_backend.data + 8) =
                 result_1.m_backend.data._M_elems._8_8_;
            pnVar3[uVar13].m_backend.exp = result_1.m_backend.exp;
            pnVar3[uVar13].m_backend.neg = result_1.m_backend.neg;
            pnVar3[uVar13].m_backend.fpclass = result_1.m_backend.fpclass;
            pnVar3[uVar13].m_backend.prec_elem = result_1.m_backend.prec_elem;
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems._24_5_ = 0;
            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
            result_1.m_backend.data._M_elems._32_5_ = 0;
            result_1.m_backend.data._M_elems[9]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_1.m_backend,
                       &(local_6d8->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar13].m_backend,&local_738);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (local_6f8,&result_1.m_backend);
          }
        }
      }
      local_2c8.m_backend.data._M_elems[9]._1_3_ = local_778.data._M_elems[9]._1_3_;
      local_2c8.m_backend.data._M_elems._32_5_ = local_778.data._M_elems._32_5_;
      local_2c8.m_backend.data._M_elems[4] = local_778.data._M_elems[4];
      local_2c8.m_backend.data._M_elems[5] = local_778.data._M_elems[5];
      local_2c8.m_backend.data._M_elems[6] = local_778.data._M_elems[6];
      local_2c8.m_backend.data._M_elems[7] = local_778.data._M_elems[7];
      local_2c8.m_backend.data._M_elems[0] = local_778.data._M_elems[0];
      local_2c8.m_backend.data._M_elems[1] = local_778.data._M_elems[1];
      local_2c8.m_backend.data._M_elems[2] = local_778.data._M_elems[2];
      local_2c8.m_backend.data._M_elems[3] = local_778.data._M_elems[3];
      local_2c8.m_backend.exp = local_778.exp;
      local_2c8.m_backend.neg = local_778.neg;
      local_2c8.m_backend.fpclass = local_778.fpclass;
      local_2c8.m_backend.prec_elem = local_778.prec_elem;
      pdVar11 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_a0,-*pdVar11,(type *)0x0);
      local_308.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8)
      ;
      local_308.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      local_308.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      local_308.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4)
      ;
      local_308.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6)
      ;
      local_308.m_backend.exp = (eps->m_backend).exp;
      local_308.m_backend.neg = (eps->m_backend).neg;
      local_308.m_backend.fpclass = (eps->m_backend).fpclass;
      local_308.m_backend.prec_elem = (eps->m_backend).prec_elem;
      bVar9 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_2c8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_a0,&local_308);
      if (bVar9) {
        local_348.m_backend.data._M_elems[9]._1_3_ = local_778.data._M_elems[9]._1_3_;
        local_348.m_backend.data._M_elems._32_5_ = local_778.data._M_elems._32_5_;
        local_348.m_backend.data._M_elems[7] = local_778.data._M_elems[7];
        local_348.m_backend.data._M_elems[6] = local_778.data._M_elems[6];
        local_348.m_backend.data._M_elems[4] = local_778.data._M_elems[4];
        local_348.m_backend.data._M_elems[5] = local_778.data._M_elems[5];
        local_348.m_backend.data._M_elems[0] = local_778.data._M_elems[0];
        local_348.m_backend.data._M_elems[1] = local_778.data._M_elems[1];
        local_348.m_backend.data._M_elems[2] = local_778.data._M_elems[2];
        local_348.m_backend.data._M_elems[3] = local_778.data._M_elems[3];
        local_348.m_backend.exp = local_778.exp;
        local_348.m_backend.neg = local_778.neg;
        local_348.m_backend.fpclass = local_778.fpclass;
        local_348.m_backend.prec_elem = local_778.prec_elem;
        local_388.m_backend.data._M_elems[7] = local_738.data._M_elems[7];
        local_388.m_backend.data._M_elems[6] = local_738.data._M_elems[6];
        local_388.m_backend.data._M_elems[0] = local_738.data._M_elems[0];
        local_388.m_backend.data._M_elems[1] = local_738.data._M_elems[1];
        local_388.m_backend.data._M_elems[2] = local_738.data._M_elems[2];
        local_388.m_backend.data._M_elems[3] = local_738.data._M_elems[3];
        local_388.m_backend.data._M_elems[4] = local_738.data._M_elems[4];
        local_388.m_backend.data._M_elems[5] = local_738.data._M_elems[5];
        local_388.m_backend.data._M_elems[9]._1_3_ = local_738.data._M_elems[9]._1_3_;
        local_388.m_backend.data._M_elems._32_5_ = local_738.data._M_elems._32_5_;
        local_388.m_backend.exp = local_738.exp;
        local_388.m_backend.neg = local_738.neg;
        local_388.m_backend.fpclass = local_738.fpclass;
        local_388.m_backend.prec_elem = local_738.prec_elem;
        local_3c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_3c8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_3c8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_3c8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_3c8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_3c8.m_backend.exp = (eps->m_backend).exp;
        local_3c8.m_backend.neg = (eps->m_backend).neg;
        local_3c8.m_backend.fpclass = (eps->m_backend).fpclass;
        local_3c8.m_backend.prec_elem = (eps->m_backend).prec_elem;
        bVar9 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_348,&local_388,&local_3c8);
        if (bVar9) {
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend.data._M_elems[9]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1.m_backend,&local_6c8,&eps->m_backend);
          tVar10 = boost::multiprecision::operator>=
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_778,&result_1);
          if ((tVar10) &&
             (*(int *)(p_delta.m_backend.data._M_elems._8_8_ + uVar13 * 4) * local_6e8->theRep < 0))
          {
            dVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double
                              (&minrandom.m_backend);
            dVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double
                              (&maxrandom.m_backend);
            local_740 = Random::next(&pSVar8->random,dVar6,dVar7);
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems._24_5_ = 0;
            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
            result_1.m_backend.data._M_elems._32_5_ = 0;
            result_1.m_backend.data._M_elems[9]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                      (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)local_6f0,&local_740);
            pnVar3 = (local_6e0->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)((long)&pnVar3[uVar13].m_backend.data + 0x20) =
                 CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                          result_1.m_backend.data._M_elems._32_5_);
            puVar1 = (uint *)((long)&pnVar3[uVar13].m_backend.data + 0x10);
            *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._16_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,
                          result_1.m_backend.data._M_elems._24_5_);
            *(undefined8 *)&pnVar3[uVar13].m_backend.data = result_1.m_backend.data._M_elems._0_8_;
            *(undefined8 *)((long)&pnVar3[uVar13].m_backend.data + 8) =
                 result_1.m_backend.data._M_elems._8_8_;
            pnVar3[uVar13].m_backend.exp = result_1.m_backend.exp;
            pnVar3[uVar13].m_backend.neg = result_1.m_backend.neg;
            pnVar3[uVar13].m_backend.fpclass = result_1.m_backend.fpclass;
            pnVar3[uVar13].m_backend.prec_elem = result_1.m_backend.prec_elem;
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems._24_5_ = 0;
            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
            result_1.m_backend.data._M_elems._32_5_ = 0;
            result_1.m_backend.data._M_elems[9]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_1.m_backend,
                       &(local_6e0->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar13].m_backend,&local_778);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (local_6f8,&result_1.m_backend);
          }
        }
      }
    }
  }
  else {
    pnVar3 = (local_6f0->thedelta).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_6d0 = &pSVar8->random;
    for (uVar14 = ~p_delta.m_backend.data._M_elems[4] + (local_6f0->thedelta).super_IdxSet.num;
        -1 < (int)uVar14; uVar14 = uVar14 - p_delta.m_backend.data._M_elems[6]) {
      lVar12 = (long)(local_6f0->thedelta).super_IdxSet.idx[uVar14];
      uVar4 = *(undefined8 *)((long)&pnVar3[lVar12].m_backend.data + 0x20);
      local_6c8.data._M_elems._32_5_ = SUB85(uVar4,0);
      local_6c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_6c8.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[lVar12].m_backend.data;
      local_6c8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[lVar12].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[lVar12].m_backend.data + 0x10);
      local_6c8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_6c8.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_6c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_6c8.exp = pnVar3[lVar12].m_backend.exp;
      local_6c8.neg = pnVar3[lVar12].m_backend.neg;
      local_6c8.fpclass = pnVar3[lVar12].m_backend.fpclass;
      local_6c8.prec_elem = pnVar3[lVar12].m_backend.prec_elem;
      pnVar5 = (local_6d8->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = *(undefined8 *)((long)&pnVar5[lVar12].m_backend.data + 0x20);
      local_738.data._M_elems._32_5_ = SUB85(uVar4,0);
      local_738.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_738.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[lVar12].m_backend.data;
      local_738.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar5[lVar12].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar12].m_backend.data + 0x10);
      local_738.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_738.data._M_elems[6] = (uint)uVar4;
      local_738.data._M_elems[7] = (uint)((ulong)uVar4 >> 0x20);
      local_738.exp = pnVar5[lVar12].m_backend.exp;
      local_738.neg = pnVar5[lVar12].m_backend.neg;
      local_738.fpclass = pnVar5[lVar12].m_backend.fpclass;
      local_738.prec_elem = pnVar5[lVar12].m_backend.prec_elem;
      pnVar5 = (local_6e0->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = *(undefined8 *)((long)&pnVar5[lVar12].m_backend.data + 0x20);
      local_778.data._M_elems._32_5_ = SUB85(uVar4,0);
      local_778.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_778.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[lVar12].m_backend.data;
      local_778.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar5[lVar12].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar12].m_backend.data + 0x10);
      local_778.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_778.data._M_elems[6] = (uint)uVar4;
      local_778.data._M_elems[7] = (uint)((ulong)uVar4 >> 0x20);
      local_778.exp = pnVar5[lVar12].m_backend.exp;
      local_778.neg = pnVar5[lVar12].m_backend.neg;
      local_778.fpclass = pnVar5[lVar12].m_backend.fpclass;
      local_778.prec_elem = pnVar5[lVar12].m_backend.prec_elem;
      uVar4 = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
      result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
      result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      result_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      result_1.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      result_1.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
      uVar4 = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
      result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
      result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      result_1.m_backend.exp = (eps->m_backend).exp;
      result_1.m_backend.neg = (eps->m_backend).neg;
      result_1.m_backend.fpclass = (eps->m_backend).fpclass;
      result_1.m_backend.prec_elem = (eps->m_backend).prec_elem;
      if (result_1.m_backend.fpclass != cpp_dec_float_finite ||
          result_1.m_backend.data._M_elems[0] != 0) {
        result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
      }
      tVar10 = boost::multiprecision::operator<
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_6c8,&result_1);
      if (tVar10) {
        local_408.m_backend.data._M_elems[9]._1_3_ = local_738.data._M_elems[9]._1_3_;
        local_408.m_backend.data._M_elems._32_5_ = local_738.data._M_elems._32_5_;
        local_408.m_backend.data._M_elems[4] = local_738.data._M_elems[4];
        local_408.m_backend.data._M_elems[5] = local_738.data._M_elems[5];
        local_408.m_backend.data._M_elems[6] = local_738.data._M_elems[6];
        local_408.m_backend.data._M_elems[7] = local_738.data._M_elems[7];
        local_408.m_backend.data._M_elems[0] = local_738.data._M_elems[0];
        local_408.m_backend.data._M_elems[1] = local_738.data._M_elems[1];
        local_408.m_backend.data._M_elems[2] = local_738.data._M_elems[2];
        local_408.m_backend.data._M_elems[3] = local_738.data._M_elems[3];
        local_408.m_backend.exp = local_738.exp;
        local_408.m_backend.neg = local_738.neg;
        local_408.m_backend.fpclass = local_738.fpclass;
        local_408.m_backend.prec_elem = local_738.prec_elem;
        pdVar11 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_d8,*pdVar11,(type *)0x0);
        local_448.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_448.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_448.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_448.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_448.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_448.m_backend.exp = (eps->m_backend).exp;
        local_448.m_backend.neg = (eps->m_backend).neg;
        local_448.m_backend.fpclass = (eps->m_backend).fpclass;
        local_448.m_backend.prec_elem = (eps->m_backend).prec_elem;
        bVar9 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_408,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_d8,&local_448);
        if (bVar9) {
          local_488.m_backend.data._M_elems[9]._1_3_ = local_778.data._M_elems[9]._1_3_;
          local_488.m_backend.data._M_elems._32_5_ = local_778.data._M_elems._32_5_;
          local_488.m_backend.data._M_elems[7] = local_778.data._M_elems[7];
          local_488.m_backend.data._M_elems[6] = local_778.data._M_elems[6];
          local_488.m_backend.data._M_elems[4] = local_778.data._M_elems[4];
          local_488.m_backend.data._M_elems[5] = local_778.data._M_elems[5];
          local_488.m_backend.data._M_elems[0] = local_778.data._M_elems[0];
          local_488.m_backend.data._M_elems[1] = local_778.data._M_elems[1];
          local_488.m_backend.data._M_elems[2] = local_778.data._M_elems[2];
          local_488.m_backend.data._M_elems[3] = local_778.data._M_elems[3];
          local_488.m_backend.exp = local_778.exp;
          local_488.m_backend.neg = local_778.neg;
          local_488.m_backend.fpclass = local_778.fpclass;
          local_488.m_backend.prec_elem = local_778.prec_elem;
          local_4c8.m_backend.data._M_elems[7] = local_738.data._M_elems[7];
          local_4c8.m_backend.data._M_elems[6] = local_738.data._M_elems[6];
          local_4c8.m_backend.data._M_elems[0] = local_738.data._M_elems[0];
          local_4c8.m_backend.data._M_elems[1] = local_738.data._M_elems[1];
          local_4c8.m_backend.data._M_elems[2] = local_738.data._M_elems[2];
          local_4c8.m_backend.data._M_elems[3] = local_738.data._M_elems[3];
          local_4c8.m_backend.data._M_elems[4] = local_738.data._M_elems[4];
          local_4c8.m_backend.data._M_elems[5] = local_738.data._M_elems[5];
          local_4c8.m_backend.data._M_elems[9]._1_3_ = local_738.data._M_elems[9]._1_3_;
          local_4c8.m_backend.data._M_elems._32_5_ = local_738.data._M_elems._32_5_;
          local_4c8.m_backend.exp = local_738.exp;
          local_4c8.m_backend.neg = local_738.neg;
          local_4c8.m_backend.fpclass = local_738.fpclass;
          local_4c8.m_backend.prec_elem = local_738.prec_elem;
          local_508.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_508.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_508.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_508.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_508.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_508.m_backend.exp = (eps->m_backend).exp;
          local_508.m_backend.neg = (eps->m_backend).neg;
          local_508.m_backend.fpclass = (eps->m_backend).fpclass;
          local_508.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar9 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_488,&local_4c8,&local_508);
          if (bVar9) {
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems._24_5_ = 0;
            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
            result_1.m_backend.data._M_elems._32_5_ = 0;
            result_1.m_backend.data._M_elems[9]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_1.m_backend,&local_738,&eps->m_backend);
            local_690 = &pnVar2[lVar12].m_backend;
            tVar10 = boost::multiprecision::operator>=
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&pnVar2[lVar12].m_backend,&result_1);
            if ((tVar10) &&
               (*(int *)(p_delta.m_backend.data._M_elems._8_8_ + lVar12 * 4) * local_6e8->theRep < 0
               )) {
              dVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double
                                (&minrandom.m_backend);
              dVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double
                                (&maxrandom.m_backend);
              local_740 = Random::next(local_6d0,dVar6,dVar7);
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems._24_5_ = 0;
              result_1.m_backend.data._M_elems[7]._1_3_ = 0;
              result_1.m_backend.data._M_elems._32_5_ = 0;
              result_1.m_backend.data._M_elems[9]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                        (&result_1.m_backend,local_690,&local_740);
              pnVar5 = (local_6d8->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)((long)&pnVar5[lVar12].m_backend.data + 0x20) =
                   CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                            result_1.m_backend.data._M_elems._32_5_);
              puVar1 = (uint *)((long)&pnVar5[lVar12].m_backend.data + 0x10);
              *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._16_8_;
              *(ulong *)(puVar1 + 2) =
                   CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,
                            result_1.m_backend.data._M_elems._24_5_);
              *(undefined8 *)&pnVar5[lVar12].m_backend.data = result_1.m_backend.data._M_elems._0_8_
              ;
              *(undefined8 *)((long)&pnVar5[lVar12].m_backend.data + 8) =
                   result_1.m_backend.data._M_elems._8_8_;
              pnVar5[lVar12].m_backend.exp = result_1.m_backend.exp;
              pnVar5[lVar12].m_backend.neg = result_1.m_backend.neg;
              pnVar5[lVar12].m_backend.fpclass = result_1.m_backend.fpclass;
              pnVar5[lVar12].m_backend.prec_elem = result_1.m_backend.prec_elem;
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems._24_5_ = 0;
              result_1.m_backend.data._M_elems[7]._1_3_ = 0;
              result_1.m_backend.data._M_elems._32_5_ = 0;
              result_1.m_backend.data._M_elems[9]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result_1.m_backend,
                         &(local_6d8->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar12].m_backend,&local_738);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_6f8,&result_1.m_backend);
            }
          }
        }
      }
      else {
        tVar10 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_6c8,eps);
        if (tVar10) {
          local_548.m_backend.data._M_elems[9]._1_3_ = local_778.data._M_elems[9]._1_3_;
          local_548.m_backend.data._M_elems._32_5_ = local_778.data._M_elems._32_5_;
          local_548.m_backend.data._M_elems[4] = local_778.data._M_elems[4];
          local_548.m_backend.data._M_elems[5] = local_778.data._M_elems[5];
          local_548.m_backend.data._M_elems[6] = local_778.data._M_elems[6];
          local_548.m_backend.data._M_elems[7] = local_778.data._M_elems[7];
          local_548.m_backend.data._M_elems[0] = local_778.data._M_elems[0];
          local_548.m_backend.data._M_elems[1] = local_778.data._M_elems[1];
          local_548.m_backend.data._M_elems[2] = local_778.data._M_elems[2];
          local_548.m_backend.data._M_elems[3] = local_778.data._M_elems[3];
          local_548.m_backend.exp = local_778.exp;
          local_548.m_backend.neg = local_778.neg;
          local_548.m_backend.fpclass = local_778.fpclass;
          local_548.m_backend.prec_elem = local_778.prec_elem;
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_110,-*pdVar11,(type *)0x0);
          local_588.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_588.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_588.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_588.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_588.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_588.m_backend.exp = (eps->m_backend).exp;
          local_588.m_backend.neg = (eps->m_backend).neg;
          local_588.m_backend.fpclass = (eps->m_backend).fpclass;
          local_588.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar9 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_548,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_110,&local_588);
          if (bVar9) {
            local_5c8.m_backend.data._M_elems[9]._1_3_ = local_778.data._M_elems[9]._1_3_;
            local_5c8.m_backend.data._M_elems._32_5_ = local_778.data._M_elems._32_5_;
            local_5c8.m_backend.data._M_elems[7] = local_778.data._M_elems[7];
            local_5c8.m_backend.data._M_elems[6] = local_778.data._M_elems[6];
            local_5c8.m_backend.data._M_elems[4] = local_778.data._M_elems[4];
            local_5c8.m_backend.data._M_elems[5] = local_778.data._M_elems[5];
            local_5c8.m_backend.data._M_elems[0] = local_778.data._M_elems[0];
            local_5c8.m_backend.data._M_elems[1] = local_778.data._M_elems[1];
            local_5c8.m_backend.data._M_elems[2] = local_778.data._M_elems[2];
            local_5c8.m_backend.data._M_elems[3] = local_778.data._M_elems[3];
            local_5c8.m_backend.exp = local_778.exp;
            local_5c8.m_backend.neg = local_778.neg;
            local_5c8.m_backend.fpclass = local_778.fpclass;
            local_5c8.m_backend.prec_elem = local_778.prec_elem;
            local_608.m_backend.data._M_elems[7] = local_738.data._M_elems[7];
            local_608.m_backend.data._M_elems[6] = local_738.data._M_elems[6];
            local_608.m_backend.data._M_elems[0] = local_738.data._M_elems[0];
            local_608.m_backend.data._M_elems[1] = local_738.data._M_elems[1];
            local_608.m_backend.data._M_elems[2] = local_738.data._M_elems[2];
            local_608.m_backend.data._M_elems[3] = local_738.data._M_elems[3];
            local_608.m_backend.data._M_elems[4] = local_738.data._M_elems[4];
            local_608.m_backend.data._M_elems[5] = local_738.data._M_elems[5];
            local_608.m_backend.data._M_elems[9]._1_3_ = local_738.data._M_elems[9]._1_3_;
            local_608.m_backend.data._M_elems._32_5_ = local_738.data._M_elems._32_5_;
            local_608.m_backend.exp = local_738.exp;
            local_608.m_backend.neg = local_738.neg;
            local_608.m_backend.fpclass = local_738.fpclass;
            local_608.m_backend.prec_elem = local_738.prec_elem;
            local_648.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
            local_648.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 2);
            local_648.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 4);
            local_648.m_backend.data._M_elems._24_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 6);
            local_648.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 8);
            local_648.m_backend.exp = (eps->m_backend).exp;
            local_648.m_backend.neg = (eps->m_backend).neg;
            local_648.m_backend.fpclass = (eps->m_backend).fpclass;
            local_648.m_backend.prec_elem = (eps->m_backend).prec_elem;
            bVar9 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_5c8,&local_608,&local_648);
            if (bVar9) {
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems._24_5_ = 0;
              result_1.m_backend.data._M_elems[7]._1_3_ = 0;
              result_1.m_backend.data._M_elems._32_5_ = 0;
              result_1.m_backend.data._M_elems[9]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result_1.m_backend,&local_778,&eps->m_backend);
              tVar10 = boost::multiprecision::operator<=
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&pnVar2[lVar12].m_backend,&result_1);
              if ((tVar10) &&
                 (*(int *)(p_delta.m_backend.data._M_elems._8_8_ + lVar12 * 4) * local_6e8->theRep <
                  0)) {
                dVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        extract_double(&minrandom.m_backend);
                dVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        extract_double(&maxrandom.m_backend);
                local_740 = Random::next(local_6d0,dVar6,dVar7);
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 10;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems._24_5_ = 0;
                result_1.m_backend.data._M_elems[7]._1_3_ = 0;
                result_1.m_backend.data._M_elems._32_5_ = 0;
                result_1.m_backend.data._M_elems[9]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                          (&result_1.m_backend,&pnVar2[lVar12].m_backend,&local_740);
                pnVar5 = (local_6e0->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)&pnVar5[lVar12].m_backend.data + 0x20) =
                     CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                              result_1.m_backend.data._M_elems._32_5_);
                puVar1 = (uint *)((long)&pnVar5[lVar12].m_backend.data + 0x10);
                *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._16_8_;
                *(ulong *)(puVar1 + 2) =
                     CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,
                              result_1.m_backend.data._M_elems._24_5_);
                *(undefined8 *)&pnVar5[lVar12].m_backend.data =
                     result_1.m_backend.data._M_elems._0_8_;
                *(undefined8 *)((long)&pnVar5[lVar12].m_backend.data + 8) =
                     result_1.m_backend.data._M_elems._8_8_;
                pnVar5[lVar12].m_backend.exp = result_1.m_backend.exp;
                pnVar5[lVar12].m_backend.neg = result_1.m_backend.neg;
                pnVar5[lVar12].m_backend.fpclass = result_1.m_backend.fpclass;
                pnVar5[lVar12].m_backend.prec_elem = result_1.m_backend.prec_elem;
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 10;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems._24_5_ = 0;
                result_1.m_backend.data._M_elems[7]._1_3_ = 0;
                result_1.m_backend.data._M_elems._32_5_ = 0;
                result_1.m_backend.data._M_elems[9]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (&result_1.m_backend,
                           &(local_6e0->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar12].m_backend,&local_778);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (local_6f8,&result_1.m_backend);
              }
            }
          }
        }
      }
    }
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_6f8;
}

Assistant:

R SPxSolverBase<R>::perturbMin(
   const UpdateVector<R>& uvec,
   VectorBase<R>& p_low,
   VectorBase<R>& p_up,
   R eps,
   R p_delta,
   const typename SPxBasisBase<R>::Desc::Status* stat,
   int start,
   int incr)
{
   assert(uvec.dim() == p_low.dim());
   assert(uvec.dim() == p_up.dim());

   const R* vec = uvec.get_const_ptr();
   R minrandom = 10.0 * p_delta;
   R maxrandom = 100.0 * p_delta;
   R x, l, u;
   int i;
   R l_theShift = 0;

   if(fullPerturbation)
   {
      eps = p_delta;

      for(i = uvec.dim() - start - 1; i >= 0; i -= incr)
      {
         u = p_up[i];
         l = p_low[i];
         x = vec[i];

         if(LT(u, R(infinity), eps) && NE(l, u, eps) && u <= x + eps && rep() * stat[i] < 0)
         {
            p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
            l_theShift += p_up[i] - u;
         }

         if(GT(l, R(-infinity), eps) && NE(l, u, eps) && l >= x - eps && rep() * stat[i] < 0)
         {
            p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
            l_theShift -= p_low[i] - l;
         }
      }
   }
   else
   {
      const R* upd = uvec.delta().values();
      const IdxSet& idx = uvec.delta().indices();

      for(int j = uvec.delta().size() - start - 1; j >= 0; j -= incr)
      {
         i = idx.index(j);
         x = upd[i];
         u = p_up[i];
         l = p_low[i];

         if(x < -eps)
         {
            if(LT(u, R(infinity), eps) && NE(l, u, eps) && vec[i] >= u - eps && rep() * stat[i] < 0)
            {
               p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
               l_theShift += p_up[i] - u;
            }
         }
         else if(x > eps)
         {
            if(GT(l, R(-infinity), eps) && NE(l, u, eps) && vec[i] <= l + eps && rep() * stat[i] < 0)
            {
               p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
               l_theShift -= p_low[i] - l;
            }
         }
      }
   }

   return l_theShift;
}